

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

int Ssw_SecCexResimulate(Aig_Man_t *p,int *pModel,int *pnOutputs)

{
  undefined1 *puVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  long lVar5;
  int i;
  
  *pnOutputs = 0;
  puVar1 = &p->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x10;
  for (lVar5 = 0; lVar5 < p->vCis->nSize; lVar5 = lVar5 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,(int)lVar5);
    *(ulong *)((long)pvVar3 + 0x18) =
         *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef | (ulong)((pModel[lVar5] & 1U) << 4);
  }
  for (iVar4 = 0; iVar4 < p->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(p->vObjs,iVar4);
    if ((pvVar3 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef |
           (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                    *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 4) &
                    ((uint)*(ulong *)((long)pvVar3 + 8) ^
                    *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18) >> 4) & 1)
                  << 4);
    }
  }
  iVar4 = 0;
  while( true ) {
    p_00 = p->vCos;
    iVar2 = p_00->nSize;
    if (iVar2 <= iVar4) break;
    pvVar3 = Vec_PtrEntry(p_00,iVar4);
    *(ulong *)((long)pvVar3 + 0x18) =
         *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef |
         (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 4 ^
                 *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x10);
    iVar4 = iVar4 + 1;
  }
  iVar4 = -1;
  for (i = 0; i < iVar2; i = i + 1) {
    pvVar3 = Vec_PtrEntry(p_00,i);
    if ((*(byte *)((long)pvVar3 + 0x18) & 0x10) != 0) {
      if (iVar4 == -1) {
        iVar4 = i;
      }
      *pnOutputs = *pnOutputs + 1;
    }
    p_00 = p->vCos;
    iVar2 = p_00->nSize;
  }
  Aig_ManCleanMarkA(p);
  return iVar4;
}

Assistant:

int Ssw_SecCexResimulate( Aig_Man_t * p, int * pModel, int * pnOutputs )
{
    Aig_Obj_t * pObj;
    int i, RetValue = -1;
    *pnOutputs = 0;
    Aig_ManConst1(p)->fMarkA = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkA = pModel[i];
    Aig_ManForEachNode( p, pObj, i )
        pObj->fMarkA = ( Aig_ObjFanin0(pObj)->fMarkA ^ Aig_ObjFaninC0(pObj) ) & 
                      ( Aig_ObjFanin1(pObj)->fMarkA ^ Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p, pObj, i )
        pObj->fMarkA = Aig_ObjFanin0(pObj)->fMarkA ^ Aig_ObjFaninC0(pObj);
    Aig_ManForEachCo( p, pObj, i )
        if ( pObj->fMarkA )
        {
            if ( RetValue == -1 )
                RetValue = i;
            (*pnOutputs)++;
        }
    Aig_ManCleanMarkA(p);
    return RetValue;
}